

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.cpp
# Opt level: O1

void __thiscall
Js::ScriptFunction::ScriptFunction
          (ScriptFunction *this,FunctionProxy *proxy,ScriptFunctionType *type)

{
  code *pcVar1;
  bool bVar2;
  State SVar3;
  uint32 uVar4;
  undefined4 *puVar5;
  ScriptFunctionType *pSVar6;
  FunctionEntryPointInfo *this_00;
  ScriptContext *pSVar7;
  
  JavascriptFunction::JavascriptFunction
            ((JavascriptFunction *)this,&type->super_DynamicType,(proxy->functionInfo).ptr);
  (this->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
  super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
  _vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_0154b518;
  Memory::Recycler::WBSetBit((char *)&this->environment);
  (this->environment).ptr = (FrameDisplay *)&NullFrameDisplay;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->environment);
  (this->cachedScopeObj).ptr = (ActivationObjectEx *)0x0;
  this->hasInlineCaches = false;
  if ((((proxy->functionInfo).ptr)->functionBodyImpl).ptr != proxy) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                ,0x22,"(proxy->GetFunctionInfo()->GetFunctionProxy() == proxy)",
                                "proxy->GetFunctionInfo()->GetFunctionProxy() == proxy");
    if (!bVar2) goto LAB_00d5753f;
    *puVar5 = 0;
  }
  pSVar6 = FunctionProxy::GetDeferredPrototypeType(proxy);
  if (pSVar6 != type) {
    pSVar6 = FunctionProxy::GetUndeferredFunctionType(proxy);
    if (pSVar6 != type) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                  ,0x23,
                                  "(proxy->GetDeferredPrototypeType() == type || proxy->GetUndeferredFunctionType() == type)"
                                  ,
                                  "proxy->GetDeferredPrototypeType() == type || proxy->GetUndeferredFunctionType() == type"
                                 );
      if (!bVar2) goto LAB_00d5753f;
      *puVar5 = 0;
    }
  }
  JavascriptFunction::VerifyEntryPoint((JavascriptFunction *)this);
  if ((proxy->functionInfo).ptr == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4f1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar2) goto LAB_00d5753f;
    *puVar5 = 0;
  }
  if ((((proxy->functionInfo).ptr)->functionBodyImpl).ptr != proxy) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4f2,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar2) goto LAB_00d5753f;
    *puVar5 = 0;
  }
  if ((((proxy->functionInfo).ptr)->attributes & (DeferredParse|DeferredDeserialize)) == None) {
    bVar2 = FunctionProxy::IsFunctionBody(proxy);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
      if (!bVar2) {
LAB_00d5753f:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    if (((ulong)proxy[5].functionInfo.ptr & 2) == 0) {
      this_00 = FunctionBody::GetDefaultFunctionEntryPointInfo((FunctionBody *)proxy);
      SVar3 = EntryPointInfo::GetState(&this_00->super_EntryPointInfo);
      if (SVar3 == CodeGenDone) {
        uVar4 = FunctionBody::GetCountField((FunctionBody *)proxy,ByteCodeCount);
        pSVar7 = Js::Type::GetScriptContext((Type *)type);
        pSVar7->jitCodeUsed = pSVar7->jitCodeUsed + uVar4;
        pSVar7 = Js::Type::GetScriptContext((Type *)type);
        pSVar7->funcJitCodeUsed = pSVar7->funcJitCodeUsed + 1;
        *(byte *)&proxy[5].functionInfo.ptr = *(byte *)&proxy[5].functionInfo.ptr | 2;
      }
    }
  }
  return;
}

Assistant:

ScriptFunction::ScriptFunction(FunctionProxy * proxy, ScriptFunctionType* type)
        : ScriptFunctionBase(type, proxy->GetFunctionInfo()),
        environment((FrameDisplay*)&NullFrameDisplay), cachedScopeObj(nullptr),
        hasInlineCaches(false)
    {
        Assert(proxy->GetFunctionInfo()->GetFunctionProxy() == proxy);
        Assert(proxy->GetDeferredPrototypeType() == type || proxy->GetUndeferredFunctionType() == type);
        DebugOnly(VerifyEntryPoint());

#if ENABLE_NATIVE_CODEGEN
        if (!proxy->IsDeferred())
        {
            FunctionBody* body = proxy->GetFunctionBody();
            if(!body->GetNativeEntryPointUsed() &&
                body->GetDefaultFunctionEntryPointInfo()->IsCodeGenDone())
            {
                MemoryBarrier();
#ifdef BGJIT_STATS
                type->GetScriptContext()->jitCodeUsed += body->GetByteCodeCount();
                type->GetScriptContext()->funcJitCodeUsed++;
#endif
                body->SetNativeEntryPointUsed(true);
            }
        }
#endif
    }